

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O1

void gmlc::networking::AsioContextManager::closeContext(string *contextName)

{
  char cVar1;
  long lVar2;
  _Base_ptr this;
  work *__ptr;
  long lVar3;
  int iVar4;
  iterator __position;
  unique_lock<std::mutex> ctxlock;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = (mutex_type *)contextLock;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
                       *)contexts_abi_cxx11_,contextName);
  if (__position._M_node != (_Base_ptr)(contexts_abi_cxx11_ + 8)) {
    lVar2 = *(long *)(__position._M_node + 2);
    this = __position._M_node[2]._M_parent;
    if (this != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
    ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
                    *)contexts_abi_cxx11_,(const_iterator)__position._M_node);
    std::unique_lock<std::mutex>::unlock(&local_38);
    if (*(int *)(lVar2 + 0x54) == 0) {
      if (*(long *)(lVar2 + 0x88) != 0) {
        std::__basic_future<void>::_M_get_result((__basic_future<void> *)(lVar2 + 0x88));
      }
    }
    else {
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)(lVar2 + 0x58));
      if (iVar4 != 0) {
        std::__throw_system_error(iVar4);
      }
      __ptr = *(work **)(lVar2 + 0x48);
      *(undefined8 *)(lVar2 + 0x48) = 0;
      if (__ptr != (work *)0x0) {
        std::default_delete<asio::io_context::work>::operator()
                  ((default_delete<asio::io_context::work> *)(lVar2 + 0x48),__ptr);
      }
      lVar3 = *(long *)(*(long *)(lVar2 + 0x40) + 8);
      cVar1 = *(char *)(lVar3 + 0x60);
      if (cVar1 == '\x01') {
        pthread_mutex_lock((pthread_mutex_t *)(lVar3 + 0x38));
      }
      *(undefined1 *)(lVar3 + 0xf0) = 1;
      if (*(char *)(lVar3 + 0x60) == '\x01') {
        *(byte *)(lVar3 + 0xa0) = *(byte *)(lVar3 + 0xa0) | 1;
        pthread_cond_broadcast((pthread_cond_t *)(lVar3 + 0x70));
      }
      if ((*(char *)(lVar3 + 0xd0) == '\0') && (*(long **)(lVar3 + 0xa8) != (long *)0x0)) {
        *(undefined1 *)(lVar3 + 0xd0) = 1;
        (**(code **)(**(long **)(lVar3 + 0xa8) + 8))();
      }
      if (cVar1 != '\0') {
        pthread_mutex_unlock((pthread_mutex_t *)(lVar3 + 0x38));
      }
      std::__basic_future<void>::_M_get_result((__basic_future<void> *)(lVar2 + 0x88));
      pthread_mutex_unlock((pthread_mutex_t *)(lVar2 + 0x58));
    }
    if (this != (_Base_ptr)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void AsioContextManager::closeContext(const std::string& contextName)
{
    std::unique_lock<std::mutex> ctxlock(contextLock);
    auto fnd = contexts.find(contextName);
    //    std::cout << "closing context manager\n";
    if (fnd != contexts.end()) {
        auto ptr = fnd->second;
        contexts.erase(fnd);
        ctxlock.unlock();
        if (ptr->isRunning()) {
            std::lock_guard<std::mutex> nullLock(ptr->runningLoopLock);
            ptr->nullwork.reset();
            ptr->ictx->stop();
            ptr->loopRet.get();
        } else if (ptr->loopRet.valid()) {
            ptr->loopRet.get();
        }
    }
}